

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor *c)

{
  ulong_long_type uVar1;
  bool bVar2;
  long *plVar3;
  int iVar4;
  uint extraout_var;
  long lVar5;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  error_category *extraout_RDX_01;
  error_code eVar6;
  string out;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (**c->_vptr_ICompressor)();
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  std::__cxx11::string::resize((ulong)&local_48,'\0');
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,local_48);
  (*c->_vptr_ICompressor[7])(c,local_40);
  (*c->_vptr_ICompressor[0xc])(c,3);
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)(extraout_var & 1) * 8))
            (test_suite::detail::current()::p,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1d4,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)")
  ;
  (*c->_vptr_ICompressor[5])(c,0);
  (*c->_vptr_ICompressor[3])(c,0);
  iVar4 = (*c->_vptr_ICompressor[0xc])(c,5);
  plVar3 = test_suite::detail::current()::p;
  eVar6 = make_error_code(end_of_stream);
  if (iVar4 == eVar6.val_) {
    uVar1 = (eVar6.cat_)->id_;
    bVar2 = extraout_RDX->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = extraout_RDX == eVar6.cat_;
    }
    lVar5 = 0x28;
    if (!bVar2) goto LAB_00108151;
  }
  else {
LAB_00108151:
    lVar5 = 0x30;
  }
  (**(code **)(*plVar3 + lVar5))
            (plVar3,"ec == error::end_of_stream",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1d8,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)")
  ;
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,local_48);
  (*c->_vptr_ICompressor[7])(c,local_40);
  iVar4 = (*c->_vptr_ICompressor[0xc])(c,3);
  plVar3 = test_suite::detail::current()::p;
  eVar6 = make_error_code(stream_error);
  if (iVar4 == eVar6.val_) {
    uVar1 = (eVar6.cat_)->id_;
    bVar2 = extraout_RDX_00->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = extraout_RDX_00 == eVar6.cat_;
    }
    lVar5 = 0x28;
    if (!bVar2) goto LAB_00108201;
  }
  else {
LAB_00108201:
    lVar5 = 0x30;
  }
  (**(code **)(*plVar3 + lVar5))
            (plVar3,"ec == error::stream_error",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1de,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)")
  ;
  iVar4 = (*c->_vptr_ICompressor[0xc])(c,5);
  plVar3 = test_suite::detail::current()::p;
  eVar6 = make_error_code(need_buffers);
  if (iVar4 == eVar6.val_) {
    uVar1 = (eVar6.cat_)->id_;
    bVar2 = extraout_RDX_01->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = extraout_RDX_01 == eVar6.cat_;
    }
    lVar5 = 0x28;
    if (bVar2) goto LAB_0010827d;
  }
  lVar5 = 0x30;
LAB_0010827d:
  (**(code **)(*plVar3 + lVar5))
            (plVar3,"ec == error::need_buffers",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1e0,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)")
  ;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return;
}

Assistant:

static
    void testWriteAfterFinish(ICompressor& c)
    {
        c.init();
        std::string out;
        out.resize(1024);
        string_view s = "Hello";
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        error_code ec = c.write(Flush::sync);
        BOOST_TEST(!ec);
        c.next_in(nullptr);
        c.avail_in(0);
        ec = c.write(Flush::finish);
        BOOST_TEST(ec == error::end_of_stream);
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        ec = c.write(Flush::sync);
        BOOST_TEST(ec == error::stream_error);
        ec = c.write(Flush::finish);
        BOOST_TEST(ec == error::need_buffers);
    }